

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2sSpecialFloatTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles2::Stress::anon_unknown_0::UniformCase::iterate(UniformCase *this)

{
  ChannelOrder CVar1;
  RenderContext *context;
  short sVar2;
  RenderCase *this_00;
  bool bVar3;
  int iVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  deUint32 err;
  void *__s;
  void *__s_00;
  long lVar7;
  short *psVar8;
  undefined4 extraout_var;
  short sVar9;
  long lVar10;
  int x;
  char *description;
  qpTestResult testResult;
  long lVar11;
  long lVar12;
  short *psVar13;
  short sVar14;
  short sVar15;
  void *pvVar16;
  float posX;
  float fVar17;
  float fVar18;
  Surface resultImage;
  UVec4 uniformValue;
  Surface local_1e8;
  RenderCase *local_1d0;
  void *local_1c8;
  long local_1c0;
  TextureFormat local_1b8;
  undefined1 local_1b0 [8];
  _func_int **local_1a8;
  ios_base local_138 [264];
  
  __s = operator_new(0x2110);
  memset(__s,0,0x2110);
  __s_00 = operator_new(0x16b0);
  memset(__s_00,0,0x16b0);
  tcu::Surface::Surface(&local_1e8,0x100,0x100);
  lVar7 = (long)__s + 0xc;
  lVar10 = 0;
  do {
    fVar17 = (float)(int)lVar10 / 22.0;
    lVar12 = 0;
    lVar11 = lVar7;
    do {
      fVar18 = (float)(int)lVar12 / 22.0;
      *(float *)(lVar11 + -0xc) = fVar17 + fVar17 + -1.0;
      *(float *)(lVar11 + -8) = fVar18 + fVar18 + -1.0;
      *(undefined8 *)(lVar11 + -4) = 0x3f80000000000000;
      lVar12 = lVar12 + 1;
      lVar11 = lVar11 + 0x10;
    } while (lVar12 != 0x17);
    lVar10 = lVar10 + 1;
    lVar7 = lVar7 + 0x170;
  } while (lVar10 != 0x17);
  psVar8 = (short *)((long)__s_00 + 10);
  sVar9 = 0;
  lVar7 = 0;
  do {
    lVar10 = -0x16;
    psVar13 = psVar8;
    do {
      sVar2 = (short)lVar10;
      sVar14 = sVar9 + sVar2 + 0x16;
      psVar13[-5] = sVar14;
      sVar15 = sVar9 + 0x2e + sVar2;
      psVar13[-4] = sVar15;
      psVar13[-3] = sVar9 + 0x2d + sVar2;
      psVar13[-2] = sVar14;
      psVar13[-1] = sVar15;
      *psVar13 = sVar9 + sVar2 + 0x17;
      psVar13 = psVar13 + 6;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 0);
    lVar7 = lVar7 + 1;
    sVar9 = sVar9 + 0x17;
    psVar8 = psVar8 + 0x84;
  } while (lVar7 != 0x16);
  local_1b0 = (undefined1  [8])
              ((this->super_RenderCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
              m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,
             "Drawing a grid with the shader. Setting u_special for vertex each tile to (special, special, 1, 1)."
             ,99);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  std::ios_base::~ios_base(local_138);
  iVar4 = (*((this->super_RenderCase).super_TestCase.m_context)->m_renderCtx->_vptr_RenderContext[3]
          )();
  lVar7 = CONCAT44(extraout_var,iVar4);
  uVar5 = (**(code **)(lVar7 + 0x780))
                    ((((this->super_RenderCase).m_program)->m_program).m_program,"a_pos");
  uVar6 = (**(code **)(lVar7 + 0xb48))
                    ((((this->super_RenderCase).m_program)->m_program).m_program,"u_special");
  (**(code **)(lVar7 + 0x1c0))(0,0,0,0x3f800000);
  (**(code **)(lVar7 + 0x188))(0x4000);
  (**(code **)(lVar7 + 0x1a00))(0,0,0x100,0x100);
  (**(code **)(lVar7 + 0x1680))((((this->super_RenderCase).m_program)->m_program).m_program);
  (**(code **)(lVar7 + 0x19f0))(uVar5,4,0x1406,0,0,__s);
  (**(code **)(lVar7 + 0x610))(uVar5);
  lVar10 = 0;
  pvVar16 = __s_00;
  local_1d0 = &this->super_RenderCase;
  do {
    CVar1 = (&Stress::(anonymous_namespace)::s_specialFloats)[lVar10];
    lVar11 = 0;
    local_1c8 = pvVar16;
    local_1c0 = lVar10;
    do {
      local_1b0._4_4_ =
           *(ChannelType *)((long)&Stress::(anonymous_namespace)::s_specialFloats + lVar11);
      local_1b0._0_4_ = CVar1;
      local_1a8 = (_func_int **)&DAT_3f8000003f800000;
      (**(code **)(lVar7 + 0x15a8))(uVar6,1,local_1b0);
      (**(code **)(lVar7 + 0x568))(4,6,0x1403,pvVar16);
      pvVar16 = (void *)((long)pvVar16 + 0xc);
      lVar11 = lVar11 + 4;
    } while (lVar11 != 0x58);
    lVar10 = local_1c0 + 1;
    pvVar16 = (void *)((long)local_1c8 + 0x108);
  } while (lVar10 != 0x16);
  (**(code **)(lVar7 + 0x518))(uVar5);
  this_00 = local_1d0;
  (**(code **)(lVar7 + 0x1680))(0);
  (**(code **)(lVar7 + 0x648))();
  err = (**(code **)(lVar7 + 0x800))();
  glu::checkError(err,"UniformCase::iterate",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/stress/es2sSpecialFloatTests.cpp"
                  ,0x376);
  context = ((this_00->super_TestCase).m_context)->m_renderCtx;
  local_1b8.order = RGBA;
  local_1b8.type = UNORM_INT8;
  if ((void *)local_1e8.m_pixels.m_cap != (void *)0x0) {
    local_1e8.m_pixels.m_cap = (size_t)local_1e8.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_1b0,&local_1b8,local_1e8.m_width,local_1e8.m_height,1,
             (void *)local_1e8.m_pixels.m_cap);
  glu::readPixels(context,0,0,(PixelBufferAccess *)local_1b0);
  bVar3 = RenderCase::checkResultImage(this_00,&local_1e8);
  if (bVar3) {
    bVar3 = RenderCase::drawTestPattern(this_00,false);
    testResult = (qpTestResult)!bVar3;
    description = "test pattern failed";
    if (bVar3) {
      description = "Pass";
    }
  }
  else {
    description = "missing or invalid fragments";
    testResult = QP_TEST_RESULT_FAIL;
  }
  tcu::TestContext::setTestResult
            ((this_00->super_TestCase).super_TestCase.super_TestNode.m_testCtx,testResult,
             description);
  tcu::Surface::~Surface(&local_1e8);
  operator_delete(__s_00,0x16b0);
  operator_delete(__s,0x2110);
  return STOP;
}

Assistant:

UniformCase::IterateResult UniformCase::iterate (void)
{
	// Create a [s_specialFloats] X [s_specialFloats] grid of tile with each tile having 2 [s_specialFloats] values
	// and calculate some basic operations with the floating point values. If all goes well, nothing special should happen

	std::vector<tcu::Vec4>	gridVertices	((DE_LENGTH_OF_ARRAY(s_specialFloats) + 1) * (DE_LENGTH_OF_ARRAY(s_specialFloats) + 1));
	std::vector<deUint16>	indices			(DE_LENGTH_OF_ARRAY(s_specialFloats) * DE_LENGTH_OF_ARRAY(s_specialFloats) * 6);
	tcu::Surface			resultImage		(TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);

	// vertices
	for (int x = 0; x < DE_LENGTH_OF_ARRAY(s_specialFloats) + 1; ++x)
	for (int y = 0; y < DE_LENGTH_OF_ARRAY(s_specialFloats) + 1; ++y)
	{
		const float		posX	= (float)x / (float)DE_LENGTH_OF_ARRAY(s_specialFloats) * 2.0f - 1.0f; // map from [0, len(s_specialFloats) ] to [-1, 1]
		const float		posY	= (float)y / (float)DE_LENGTH_OF_ARRAY(s_specialFloats) * 2.0f - 1.0f;

		gridVertices[x * (DE_LENGTH_OF_ARRAY(s_specialFloats)+1) + y] = tcu::Vec4(posX, posY, 0.0f, 1.0f);
	}

	// tiles
	for (int x = 0; x < DE_LENGTH_OF_ARRAY(s_specialFloats); ++x)
	for (int y = 0; y < DE_LENGTH_OF_ARRAY(s_specialFloats); ++y)
	{
		const int baseNdx = (x * (DE_LENGTH_OF_ARRAY(s_specialFloats)) + y) * 6;

		indices[baseNdx + 0] = (deUint16)((x+0) * (DE_LENGTH_OF_ARRAY(s_specialFloats) + 1) + (y+0));
		indices[baseNdx + 1] = (deUint16)((x+1) * (DE_LENGTH_OF_ARRAY(s_specialFloats) + 1) + (y+1));
		indices[baseNdx + 2] = (deUint16)((x+1) * (DE_LENGTH_OF_ARRAY(s_specialFloats) + 1) + (y+0));

		indices[baseNdx + 3] = (deUint16)((x+0) * (DE_LENGTH_OF_ARRAY(s_specialFloats) + 1) + (y+0));
		indices[baseNdx + 4] = (deUint16)((x+1) * (DE_LENGTH_OF_ARRAY(s_specialFloats) + 1) + (y+1));
		indices[baseNdx + 5] = (deUint16)((x+0) * (DE_LENGTH_OF_ARRAY(s_specialFloats) + 1) + (y+1));
	}

	m_testCtx.getLog() << tcu::TestLog::Message << "Drawing a grid with the shader. Setting u_special for vertex each tile to (special, special, 1, 1)." << tcu::TestLog::EndMessage;

	// Draw grid
	{
		const glw::Functions&	gl			= m_context.getRenderContext().getFunctions();
		const GLint				positionLoc	= gl.getAttribLocation(m_program->getProgram(), "a_pos");
		const GLint				specialLoc	= gl.getUniformLocation(m_program->getProgram(), "u_special");

		gl.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
		gl.clear(GL_COLOR_BUFFER_BIT);
		gl.viewport(0, 0, TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);
		gl.useProgram(m_program->getProgram());

		gl.vertexAttribPointer(positionLoc, 4, GL_FLOAT, GL_FALSE, 0, &gridVertices[0]);
		gl.enableVertexAttribArray(positionLoc);

		for (int x = 0; x < DE_LENGTH_OF_ARRAY(s_specialFloats); ++x)
		for (int y = 0; y < DE_LENGTH_OF_ARRAY(s_specialFloats); ++y)
		{
			const deUint32		one				= 0x3F800000;
			const tcu::UVec4	uniformValue	= tcu::UVec4(s_specialFloats[x], s_specialFloats[y], one, one);
			const int			indexIndex		= (x * DE_LENGTH_OF_ARRAY(s_specialFloats) + y) * 6;

			gl.uniform4fv(specialLoc, 1, (const float*)uniformValue.getPtr());
			gl.drawElements(GL_TRIANGLES, 6, GL_UNSIGNED_SHORT, &indices[indexIndex]);
		}

		gl.disableVertexAttribArray(positionLoc);

		gl.useProgram(0);
		gl.finish();
		GLU_EXPECT_NO_ERROR(gl.getError(), "UniformCase::iterate");

		glu::readPixels(m_context.getRenderContext(), 0, 0, resultImage.getAccess());
	}

	// verify everywhere was drawn (all pixels have Green = 255)
	if (!checkResultImage(resultImage))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "missing or invalid fragments");
		return STOP;
	}

	// test drawing still works
	if (!drawTestPattern(false))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "test pattern failed");
		return STOP;
	}

	// all ok
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}